

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tb.cc
# Opt level: O2

string * __thiscall
kratos::Sequence::to_string
          (string *__return_storage_ptr__,Sequence *this,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(kratos::Var_*)>
          *var_str)

{
  Sequence *this_00;
  string *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar1;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  undefined1 auStack_a8 [8];
  string wait_str;
  string next;
  pointer pcStack_60;
  pointer local_48;
  pointer pcStack_40;
  undefined8 local_38;
  pointer pcStack_30;
  
  wait_to_str_abi_cxx11_((string *)auStack_a8,this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (wait_str._M_dataplus._M_p == (pointer)0x0) {
    (*(this->var_->super_IRNode)._vptr_IRNode[0x21])(&local_48,this->var_,1);
    this_01 = (string *)&local_48;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,this_01);
  }
  else {
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(kratos::Var_*)>
    ::operator()((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&next.field_2 + 8),var_str,this->var_);
    local_48 = (pointer)auStack_a8;
    pcStack_40 = wait_str._M_dataplus._M_p;
    local_38 = next.field_2._8_8_;
    pcStack_30 = pcStack_60;
    bVar1 = fmt::v7::to_string_view<char,_0>("{0} {1}");
    format_str.data_ = (char *)bVar1.size_;
    format_str.size_ = 0xdd;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_48;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)((long)&wait_str.field_2 + 8),(detail *)bVar1.data_,format_str,args);
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,(string *)(wait_str.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(wait_str.field_2._M_local_buf + 8));
    this_01 = (string *)(next.field_2._M_local_buf + 8);
  }
  std::__cxx11::string::~string(this_01);
  this_00 = (this->next_).super___shared_ptr<kratos::Sequence,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (Sequence *)0x0) {
    to_string_abi_cxx11_((string *)((long)&wait_str.field_2 + 8),this_00);
    local_48 = (__return_storage_ptr__->_M_dataplus)._M_p;
    pcStack_40 = (pointer)__return_storage_ptr__->_M_string_length;
    local_38 = wait_str.field_2._8_8_;
    pcStack_30 = next._M_dataplus._M_p;
    bVar1 = fmt::v7::to_string_view<char,_0>("{0} |-> {1}");
    format_str_00.data_ = (char *)bVar1.size_;
    format_str_00.size_ = 0xdd;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_48;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)((long)&next.field_2 + 8),(detail *)bVar1.data_,format_str_00,args_00);
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,(string *)(next.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(next.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(wait_str.field_2._M_local_buf + 8));
  }
  std::__cxx11::string::~string((string *)auStack_a8);
  return __return_storage_ptr__;
}

Assistant:

std::string Sequence::to_string(const std::function<std::string(Var *)> &var_str) const {
    auto wait_str = wait_to_str();
    std::string seq;
    if (wait_str.empty())
        seq = var_->handle_name(true);
    else
        seq = ::format("{0} {1}", wait_str, var_str(var_));
    if (next_) {
        auto next = next_->to_string();
        seq = ::format("{0} |-> {1}", seq, next);
    }
    return seq;
}